

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_helpers_qpromiseall.cpp
# Opt level: O0

void __thiscall
tst_deprecations_helpers_qpromiseall::atLeastOnePromiseReject
          (tst_deprecations_helpers_qpromiseall *this)

{
  initializer_list<QtPromise::QPromise<int>_> args;
  bool bVar1;
  QPromise<int> *local_140;
  bool local_132;
  bool local_131;
  QString local_130;
  QString local_118;
  QString local_100;
  bool local_e6;
  bool local_e5;
  bool local_e4;
  bool local_e3;
  bool local_e2;
  bool local_e1 [7];
  bool local_da;
  bool local_d9;
  QPromise<int> *local_d8;
  QPromise<int> local_d0;
  QPromise<int> local_c0;
  QPromise<int> local_b0;
  QPromise<int> local_a0;
  QList<QtPromise::QPromise<int>_> local_90;
  undefined1 local_78 [8];
  QPromise<QList<int>_> p;
  undefined1 local_60 [8];
  QPromise<int> p2;
  int local_3c;
  undefined1 local_38 [8];
  Type p1;
  undefined1 local_20 [8];
  Type p0;
  tst_deprecations_helpers_qpromiseall *this_local;
  
  p1.super_QPromiseBase<int>.m_d.d._4_4_ = 0x2a;
  p0.super_QPromiseBase<int>.m_d.d = (PromiseData<int> *)this;
  QtPromise::resolve<int>
            ((QtPromise *)local_20,(int *)((long)&p1.super_QPromiseBase<int>.m_d.d + 4));
  local_3c = 0x2c;
  QtPromise::resolve<int>((QtPromise *)local_38,&local_3c);
  QtPromise::QPromise<int>::
  QPromise<tst_deprecations_helpers_qpromiseall::atLeastOnePromiseReject()::__0>
            ((QPromise<int> *)local_60,
             (anon_class_1_0_00000001 *)((long)&p.super_QPromiseBase<QList<int>_>.m_d.d + 7));
  local_d8 = &local_d0;
  QtPromise::QPromise<int>::QPromise<QtPromise::QPromise<int>&>(local_d8,(QPromise<int> *)local_20);
  local_d8 = &local_c0;
  QtPromise::QPromise<int>::QPromise<QtPromise::QPromise<int>&>(local_d8,(QPromise<int> *)local_60);
  local_d8 = &local_b0;
  QtPromise::QPromise<int>::QPromise<QtPromise::QPromise<int>&>(local_d8,(QPromise<int> *)local_38);
  local_a0.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)&local_d0;
  local_a0.super_QPromiseBase<int>.m_d.d = (PromiseData<int> *)0x3;
  args._M_len = 3;
  args._M_array = (iterator)local_a0.super_QPromiseBase<int>._vptr_QPromiseBase;
  QList<QtPromise::QPromise<int>_>::QList(&local_90,args);
  QtPromise::qPromiseAll<QList<QtPromise::QPromise<int>>>((QtPromise *)local_78,&local_90);
  QList<QtPromise::QPromise<int>_>::~QList(&local_90);
  local_140 = &local_a0;
  do {
    local_140 = local_140 + -1;
    QtPromise::QPromise<int>::~QPromise(local_140);
  } while (local_140 != &local_d0);
  local_d9 = QtPromise::QPromiseBase<int>::isFulfilled((QPromiseBase<int> *)local_20);
  local_da = true;
  bVar1 = QTest::qCompare<bool,bool>
                    (&local_d9,&local_da,"p0.isFulfilled()","true",
                     "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/deprecations/tst_helpers_qpromiseall.cpp"
                     ,0x98);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    local_e1[0] = QtPromise::QPromiseBase<int>::isFulfilled((QPromiseBase<int> *)local_38);
    local_e2 = true;
    bVar1 = QTest::qCompare<bool,bool>
                      (local_e1,&local_e2,"p1.isFulfilled()","true",
                       "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/deprecations/tst_helpers_qpromiseall.cpp"
                       ,0x99);
    if (((bVar1 ^ 0xffU) & 1) == 0) {
      local_e3 = QtPromise::QPromiseBase<int>::isPending((QPromiseBase<int> *)local_60);
      local_e4 = true;
      bVar1 = QTest::qCompare<bool,bool>
                        (&local_e3,&local_e4,"p2.isPending()","true",
                         "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/deprecations/tst_helpers_qpromiseall.cpp"
                         ,0x9a);
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        local_e5 = QtPromise::QPromiseBase<QList<int>_>::isPending
                             ((QPromiseBase<QList<int>_> *)local_78);
        local_e6 = true;
        bVar1 = QTest::qCompare<bool,bool>
                          (&local_e5,&local_e6,"p.isPending()","true",
                           "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/deprecations/tst_helpers_qpromiseall.cpp"
                           ,0x9b);
        if (((bVar1 ^ 0xffU) & 1) == 0) {
          QString::QString(&local_118);
          waitForError<QList<int>,QString>(&local_100,(QPromise<QList<int>_> *)local_78,&local_118);
          QString::QString(&local_130,"foo");
          bVar1 = QTest::qCompare(&local_100,&local_130,"waitForError(p, QString{})",
                                  "QString{\"foo\"}",
                                  "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/deprecations/tst_helpers_qpromiseall.cpp"
                                  ,0x9c);
          QString::~QString(&local_130);
          QString::~QString(&local_100);
          QString::~QString(&local_118);
          if (((bVar1 ^ 0xffU) & 1) == 0) {
            local_131 = QtPromise::QPromiseBase<int>::isRejected((QPromiseBase<int> *)local_60);
            local_132 = true;
            bVar1 = QTest::qCompare<bool,bool>
                              (&local_131,&local_132,"p2.isRejected()","true",
                               "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/deprecations/tst_helpers_qpromiseall.cpp"
                               ,0x9d);
            if (((bVar1 ^ 0xffU) & 1) == 0) {
              local_e1[1] = false;
              local_e1[2] = false;
              local_e1[3] = false;
              local_e1[4] = false;
            }
            else {
              local_e1[1] = true;
              local_e1[2] = false;
              local_e1[3] = false;
              local_e1[4] = false;
            }
          }
          else {
            local_e1[1] = true;
            local_e1[2] = false;
            local_e1[3] = false;
            local_e1[4] = false;
          }
        }
        else {
          local_e1[1] = true;
          local_e1[2] = false;
          local_e1[3] = false;
          local_e1[4] = false;
        }
      }
      else {
        local_e1[1] = true;
        local_e1[2] = false;
        local_e1[3] = false;
        local_e1[4] = false;
      }
    }
    else {
      local_e1[1] = true;
      local_e1[2] = false;
      local_e1[3] = false;
      local_e1[4] = false;
    }
  }
  else {
    local_e1[1] = true;
    local_e1[2] = false;
    local_e1[3] = false;
    local_e1[4] = false;
  }
  QtPromise::QPromise<QList<int>_>::~QPromise((QPromise<QList<int>_> *)local_78);
  QtPromise::QPromise<int>::~QPromise((QPromise<int> *)local_60);
  QtPromise::QPromise<int>::~QPromise((QPromise<int> *)local_38);
  QtPromise::QPromise<int>::~QPromise((QPromise<int> *)local_20);
  return;
}

Assistant:

void tst_deprecations_helpers_qpromiseall::atLeastOnePromiseReject()
{
    auto p0 = QtPromise::resolve(42);
    auto p1 = QtPromise::resolve(44);
    auto p2 = QtPromise::QPromise<int>{
        [](const QtPromise::QPromiseResolve<int>&, const QtPromise::QPromiseReject<int>& reject) {
            QtPromisePrivate::qtpromise_defer([=]() {
                reject(QString{"foo"});
            });
        }};

    auto p = QtPromise::qPromiseAll(QVector<QtPromise::QPromise<int>>{p0, p2, p1});

    Q_STATIC_ASSERT((std::is_same<decltype(p), QtPromise::QPromise<QVector<int>>>::value));
    QCOMPARE(p0.isFulfilled(), true);
    QCOMPARE(p1.isFulfilled(), true);
    QCOMPARE(p2.isPending(), true);
    QCOMPARE(p.isPending(), true);
    QCOMPARE(waitForError(p, QString{}), QString{"foo"});
    QCOMPARE(p2.isRejected(), true);
}